

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

uint32_t xmlDictComputeBigKey(xmlChar *data,int namelen,int seed)

{
  uint32_t uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = 0;
  if (data != (xmlChar *)0x0 && 0 < namelen) {
    for (uVar2 = 0; (uint)namelen != uVar2; uVar2 = uVar2 + 1) {
      uVar3 = (seed + (uint)data[uVar2]) * 0x401;
      seed = uVar3 >> 6 ^ uVar3;
    }
    uVar1 = ((uint)(seed * 9) >> 0xb ^ seed * 9) * 0x8001;
  }
  return uVar1;
}

Assistant:

static uint32_t
xmlDictComputeBigKey(const xmlChar* data, int namelen, int seed) {
    uint32_t hash;
    int i;

    if (namelen <= 0 || data == NULL) return(0);

    hash = seed;

    for (i = 0;i < namelen; i++) {
        hash += data[i];
	hash += (hash << 10);
	hash ^= (hash >> 6);
    }
    hash += (hash << 3);
    hash ^= (hash >> 11);
    hash += (hash << 15);

    return hash;
}